

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticEngine.cpp
# Opt level: O1

string * __thiscall
slang::DiagnosticEngine::formatMessage_abi_cxx11_
          (string *__return_storage_ptr__,DiagnosticEngine *this,Diagnostic *diag)

{
  char_pointer puVar1;
  element_type *peVar2;
  pointer pvVar3;
  uint uVar4;
  char_pointer puVar5;
  long lVar6;
  undefined8 *puVar7;
  uint uVar8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  char_pointer puVar9;
  pointer pvVar10;
  table_element_pointer ppVar11;
  _Array_type *__vtable;
  undefined1 auVar12 [16];
  iterator iVar13;
  string_view sVar14;
  string_view fmt;
  format_args args_00;
  dynamic_format_arg_store<fmt::v11::context> args;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  long *local_58;
  Diagnostic *local_50;
  string *local_48;
  anon_class_16_2_3fddba98 local_40;
  
  if ((diag->args).
      super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (diag->args).
      super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    formatMessage_abi_cxx11_();
  }
  else {
    if ((this->formatters).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>,_slang::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>_>_>
        .size_ctrl.size == 0) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>_>_>
      ::operator=((table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>_>_>
                   *)&this->formatters,
                  (table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>_>_>
                   *)&defaultFormatters);
    }
    local_48 = __return_storage_ptr__;
    iVar13 = boost::unordered::detail::foa::
             table<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>_>_>
             ::begin(&(this->formatters).table_);
    if (iVar13.p_ != (table_element_pointer)0x0) {
LAB_00183453:
      peVar2 = ((iVar13.p_)->second).
               super___shared_ptr<slang::DiagArgFormatter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (*peVar2->_vptr_DiagArgFormatter[2])(peVar2,diag);
      puVar5 = iVar13.pc_ + 2;
      do {
        puVar9 = puVar5;
        puVar5 = iVar13.pc_;
        ppVar11 = iVar13.p_ + 1;
        if (((uint)iVar13.pc_ & 0xf) == 0xe) goto LAB_0018349a;
        puVar1 = puVar9 + -1;
        iVar13.p_ = ppVar11;
        iVar13.pc_ = puVar5 + 1;
        puVar5 = puVar9 + 1;
      } while (*puVar1 == '\0');
      puVar9 = puVar9 + -1;
      if (*puVar1 == '\x01') {
        ppVar11 = (table_element_pointer)0x0;
      }
      goto LAB_0018348e;
    }
LAB_001834ee:
    local_68 = (undefined1  [16])0x0;
    local_78 = (undefined1  [16])0x0;
    local_88 = (undefined1  [16])0x0;
    local_58 = (long *)0x0;
    pvVar10 = (diag->args).
              super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pvVar3 = (diag->args).
             super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_50 = diag;
    if (pvVar10 != pvVar3) {
      do {
        lVar6 = (long)(char)(pvVar10->
                            super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>
                            ).
                            super__Move_assign_alias<std::__cxx11::basic_string<char>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>
                            .
                            super__Copy_assign_alias<std::__cxx11::basic_string<char>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>
                            .
                            super__Move_ctor_alias<std::__cxx11::basic_string<char>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>
                            .
                            super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>
                            .
                            super__Variant_storage_alias<std::__cxx11::basic_string<char>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>
                            ._M_index;
        local_40.this = this;
        if (lVar6 == -1) {
          local_40.args = (dynamic_format_arg_store<fmt::v11::context> *)local_88;
          puVar7 = (undefined8 *)__cxa_allocate_exception(0x10);
          *puVar7 = &PTR__exception_005d1438;
          puVar7[1] = "std::visit: variant is valueless";
          __cxa_throw(puVar7,&std::bad_variant_access::typeinfo,std::exception::~exception);
        }
        local_40.args = (dynamic_format_arg_store<fmt::v11::context> *)local_88;
        (*std::__detail::__variant::
          __gen_vtable<std::__detail::__variant::__deduce_visit_result<void>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/diagnostics/DiagnosticEngine.cpp:296:13)_&&,_const_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_&>
          ::_S_vtable._M_arr[lVar6]._M_data)(&local_40,pvVar10);
        pvVar10 = pvVar10 + 1;
      } while (pvVar10 != pvVar3);
    }
    sVar14 = getMessage(this,local_50->code);
    __return_storage_ptr__ = local_48;
    args_00.desc_ = local_88._0_8_ + (ulong)(local_78._8_8_ != local_68._0_8_) * 0x20;
    fmt.size_ = (ulong)(local_78._8_8_ != local_68._0_8_) << 0x3e |
                (ulong)(local_88._8_8_ - local_88._0_8_) >> 5 & 0xffffffff | 0x8000000000000000;
    fmt.data_ = (char *)sVar14._M_len;
    args_00.field_1.values_ = in_R9.values_;
    ::fmt::v11::vformat_abi_cxx11_(local_48,(v11 *)sVar14._M_str,fmt,args_00);
    if (local_58 != (long *)0x0) {
      (**(code **)(*local_58 + 8))();
    }
    local_58 = (long *)0x0;
    if ((void *)local_78._8_8_ != (void *)0x0) {
      operator_delete((void *)local_78._8_8_,local_68._8_8_ - local_78._8_8_);
    }
    if ((void *)local_88._0_8_ != (void *)0x0) {
      operator_delete((void *)local_88._0_8_,local_78._0_8_ - local_88._0_8_);
    }
  }
  return __return_storage_ptr__;
LAB_0018349a:
  do {
    auVar12[0] = -(*puVar9 == '\0');
    auVar12[1] = -(puVar9[1] == '\0');
    auVar12[2] = -(puVar9[2] == '\0');
    auVar12[3] = -(puVar9[3] == '\0');
    auVar12[4] = -(puVar9[4] == '\0');
    auVar12[5] = -(puVar9[5] == '\0');
    auVar12[6] = -(puVar9[6] == '\0');
    auVar12[7] = -(puVar9[7] == '\0');
    auVar12[8] = -(puVar9[8] == '\0');
    auVar12[9] = -(puVar9[9] == '\0');
    auVar12[10] = -(puVar9[10] == '\0');
    auVar12[0xb] = -(puVar9[0xb] == '\0');
    auVar12[0xc] = -(puVar9[0xc] == '\0');
    auVar12[0xd] = -(puVar9[0xd] == '\0');
    auVar12[0xe] = -(puVar9[0xe] == '\0');
    auVar12[0xf] = -(puVar9[0xf] == '\0');
    uVar8 = (uint)(ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe);
    if (uVar8 == 0x7fff) {
      puVar9 = puVar9 + 0x10;
      ppVar11 = ppVar11 + 0xf;
    }
    else {
      uVar4 = 0;
      if ((uVar8 ^ 0x7fff) != 0) {
        for (; ((uVar8 ^ 0x7fff) >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
        }
      }
      if (puVar9[uVar4] == '\x01') {
        ppVar11 = (table_element_pointer)0x0;
      }
      else {
        puVar9 = puVar9 + uVar4;
        ppVar11 = ppVar11 + uVar4;
      }
    }
  } while (uVar8 == 0x7fff);
LAB_0018348e:
  iVar13.p_ = ppVar11;
  iVar13.pc_ = puVar9;
  if (ppVar11 == (table_element_pointer)0x0) goto LAB_001834ee;
  goto LAB_00183453;
}

Assistant:

std::string DiagnosticEngine::formatMessage(const Diagnostic& diag) const {
    // If we have no arguments, the format string is the entire message.
    if (diag.args.empty())
        return std::string(getMessage(diag.code));

    // Let each formatter have a look at the diagnostic before we begin.
    if (formatters.empty())
        formatters = defaultFormatters;

    for (auto& [key, formatter] : formatters)
        formatter->startMessage(diag);

    // Dynamically build up the list of arguments to pass to the formatting routines.
    fmt::dynamic_format_arg_store<fmt::format_context> args;
    for (auto& arg : diag.args) {
        // Unwrap the argument type (stored as a variant).
        std::visit(
            [&](auto&& t) {
                // If the argument is a pointer, the fmtlib API needs it unwrapped into a reference.
                using T = std::decay_t<decltype(t)>;
                if constexpr (std::is_same_v<Diagnostic::CustomArgType, T>) {
                    if (auto it = formatters.find(t.first); it != formatters.end())
                        args.push_back(it->second->format(t.second));
                    else
                        SLANG_THROW(std::runtime_error("No diagnostic formatter for type"));
                }
                else if constexpr (std::is_same_v<ConstantValue, T>) {
                    if (t.isReal())
                        args.push_back(double(t.real()));
                    else if (t.isShortReal())
                        args.push_back(float(t.shortReal()));
                    else
                        args.push_back(t.toString());
                }
                else {
                    args.push_back(t);
                }
            },
            arg);
    }

    return fmt::vformat(getMessage(diag.code), args);
}